

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::SelectUtxos(JsonMappingApi *this,string *request_message)

{
  function<void_(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<void(cfd::js::api::json::SelectUtxosWrapRequest*,cfd::js::api::json::SelectUtxosWrapResponse*)>
  ::
  function<void(&)(cfd::js::api::json::SelectUtxosWrapRequest*,cfd::js::api::json::SelectUtxosWrapResponse*),void>
            ((function<void(cfd::js::api::json::SelectUtxosWrapRequest*,cfd::js::api::json::SelectUtxosWrapResponse*)>
              *)&local_38,CoinJsonApi::SelectUtxos);
  ExecuteDirectJsonApi<cfd::js::api::json::SelectUtxosWrapRequest,cfd::js::api::json::SelectUtxosWrapResponse>
            ((json *)this,request_message,&local_38);
  std::
  function<void_(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::SelectUtxos(const std::string &request_message) {
  return ExecuteDirectJsonApi<
      api::json::SelectUtxosWrapRequest, api::json::SelectUtxosWrapResponse>(
      request_message, CoinJsonApi::SelectUtxos);
}